

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

MSize lj_tab_len(GCtab *t)

{
  size_t sVar1;
  ulong uVar2;
  MSize local_34;
  size_t mid;
  size_t lo;
  size_t hi;
  GCtab *t_local;
  
  lo = (size_t)t->asize;
  if (lo != 0) {
    lo = lo - 1;
  }
  if ((lo == 0) || (*(long *)((t->array).ptr64 + lo * 8) != -1)) {
    if (t->hmask == 0) {
      local_34 = (MSize)lo;
    }
    else {
      local_34 = tab_len_slow(t,lo);
    }
    t_local._4_4_ = local_34;
  }
  else {
    mid = 0;
    sVar1 = mid;
    while (mid = sVar1, 1 < lo - mid) {
      uVar2 = mid + lo >> 1;
      sVar1 = uVar2;
      if (*(long *)((t->array).ptr64 + uVar2 * 8) == -1) {
        sVar1 = mid;
        lo = uVar2;
      }
    }
    t_local._4_4_ = (MSize)mid;
  }
  return t_local._4_4_;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len(GCtab *t)
{
  size_t hi = (size_t)t->asize;
  if (hi) hi--;
  /* In a growing array the last array element is very likely nil. */
  if (hi > 0 && LJ_LIKELY(tvisnil(arrayslot(t, hi)))) {
    /* Binary search to find a non-nil to nil transition in the array. */
    size_t lo = 0;
    while (hi - lo > 1) {
      size_t mid = (lo+hi) >> 1;
      if (tvisnil(arrayslot(t, mid))) hi = mid; else lo = mid;
    }
    return (MSize)lo;
  }
  /* Without a hash part, there's an implicit nil after the last element. */
  return t->hmask ? tab_len_slow(t, hi) : (MSize)hi;
}